

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_gt.cpp
# Opt level: O0

void __thiscall IsingFreeEnergy_Square0_Test::TestBody(IsingFreeEnergy_Square0_Test *this)

{
  fvar<double,_2UL> f_00;
  fvar<double,_2UL> fVar1;
  fvar<double,_2UL> f_01;
  fvar<double,_2UL> f_02;
  fvar<double,_2UL> beta_00;
  fvar<double,_2UL> beta_01;
  fvar<double,_2UL> beta_02;
  bool bVar2;
  undefined1 uVar3;
  AssertHelper *pAVar4;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  double in_stack_00000160;
  double in_stack_00000168;
  char *in_stack_00000170;
  char *in_stack_00000178;
  AssertionResult gtest_ar;
  double eps;
  fvar<double,_2UL> f;
  autodiff_fvar<double,_2UL> beta;
  double t;
  double Jy;
  double Jx;
  double *in_stack_fffffffffffffde0;
  Message *pMVar5;
  int iVar6;
  char *pcVar7;
  undefined4 in_stack_fffffffffffffe08;
  Type in_stack_fffffffffffffe0c;
  AssertHelper *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  AssertionResult *pAVar8;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  char *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe38;
  Message *in_stack_fffffffffffffe68;
  AssertHelper *in_stack_fffffffffffffe70;
  AssertionResult local_158 [2];
  Message *local_138;
  AssertHelper *pAStack_130;
  char *local_128;
  undefined8 local_118;
  AssertHelper *pAStack_110;
  undefined8 local_108;
  AssertionResult local_f8 [3];
  double in_stack_ffffffffffffff38;
  double in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  double in_stack_ffffffffffffff60;
  AssertionResult local_90;
  undefined8 local_80;
  Message *local_78;
  AssertHelper *pAStack_70;
  char *local_68;
  undefined8 local_58;
  AssertHelper *pAStack_50;
  undefined8 local_48;
  double local_40;
  Message *local_38;
  AssertHelper *pAStack_30;
  char *local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_10 = convert<double>((char *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  local_18 = convert<double>((char *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  local_20 = convert<double>((char *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  local_40 = 1.0 / local_20;
  boost::math::differentiation::autodiff_v1::make_fvar<double,_2UL>(in_stack_fffffffffffffde0);
  local_68 = local_28;
  local_78 = local_38;
  pAStack_70 = pAStack_30;
  beta_02.v._M_elems[1] = (double)in_stack_ffffffffffffff58;
  beta_02.v._M_elems[0] = (double)in_stack_ffffffffffffff50;
  beta_02.v._M_elems[2] = in_stack_ffffffffffffff60;
  ising::free_energy::square::
  infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,beta_02);
  local_80 = 0x3d719799812dea11;
  iVar6 = (int)((ulong)pAStack_30 >> 0x20);
  f_00.v._M_elems[1] = (double)local_48;
  f_00.v._M_elems[0] = (double)pAStack_50;
  f_00.v._M_elems[2] = (double)local_38;
  fVar1.v._M_elems[1] = (double)local_28;
  fVar1.v._M_elems[0] = (double)pAStack_30;
  fVar1.v._M_elems[2]._0_4_ = in_stack_fffffffffffffe08;
  fVar1.v._M_elems[2]._4_4_ = in_stack_fffffffffffffe0c;
  pAVar4 = pAStack_50;
  pMVar5 = local_38;
  pcVar7 = local_28;
  ising::free_energy::
  free_energy<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>(f_00,fVar1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000160);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe10);
    testing::AssertionResult::failure_message((AssertionResult *)0x10bd32);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,pcVar7,iVar6,(char *)pMVar5);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper(pAVar4);
    testing::Message::~Message((Message *)0x10bd8f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bde7);
  local_108 = local_48;
  local_118 = local_58;
  pAStack_110 = pAStack_50;
  local_128 = local_28;
  local_138 = local_38;
  pAStack_130 = pAStack_30;
  iVar6 = (int)((ulong)pAStack_30 >> 0x20);
  f_01.v._M_elems[1]._0_4_ = in_stack_fffffffffffffe08;
  f_01.v._M_elems[0] = (double)local_28;
  f_01.v._M_elems[1]._4_4_ = in_stack_fffffffffffffe0c;
  f_01.v._M_elems[2] = (double)in_stack_fffffffffffffe10;
  beta_00.v._M_elems[1]._0_7_ = in_stack_fffffffffffffe20;
  beta_00.v._M_elems[0] = (double)in_stack_fffffffffffffe18;
  beta_00.v._M_elems[1]._7_1_ = in_stack_fffffffffffffe27;
  beta_00.v._M_elems[2] = (double)in_stack_fffffffffffffe28;
  pAVar4 = pAStack_50;
  pMVar5 = local_38;
  pcVar7 = local_28;
  ising::free_energy::energy<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
            (f_01,beta_00);
  pAVar8 = local_f8;
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000160);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe28 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10beef);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,pcVar7,iVar6,(char *)pMVar5);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper(pAVar4);
    testing::Message::~Message((Message *)0x10bf4c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bfa4);
  iVar6 = (int)((ulong)pAStack_30 >> 0x20);
  f_02.v._M_elems[1] = (double)in_stack_fffffffffffffe18;
  f_02.v._M_elems[0] = (double)in_stack_fffffffffffffe10;
  f_02.v._M_elems[2]._0_7_ = in_stack_fffffffffffffe20;
  f_02.v._M_elems[2]._7_1_ = in_stack_fffffffffffffe27;
  beta_01.v._M_elems[1] = (double)pAVar8;
  beta_01.v._M_elems[0] = (double)in_stack_fffffffffffffe28;
  beta_01.v._M_elems[2]._0_7_ = in_stack_fffffffffffffe38;
  beta_01.v._M_elems[2]._7_1_ = uVar3;
  pMVar5 = local_38;
  ising::free_energy::
  specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>(f_02,beta_01);
  pAVar8 = local_158;
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000160);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe10);
    pAVar4 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10c0ac);
    testing::internal::AssertHelper::AssertHelper
              (pAVar4,in_stack_fffffffffffffe0c,local_28,iVar6,(char *)local_38);
    testing::internal::AssertHelper::operator=(pAStack_30,pMVar5);
    testing::internal::AssertHelper::~AssertHelper(pAStack_50);
    testing::Message::~Message((Message *)0x10c109);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c15e);
  return;
}

Assistant:

TEST(IsingFreeEnergy, Square0) {
  typedef double real_t;
  auto Jx = convert<real_t>("1.5");
  auto Jy = convert<real_t>("2.5");
  auto t = convert<real_t>("2");
  auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
  auto f = square::infinite(Jx, Jy, beta);
  double eps = 1e-12;
  EXPECT_DOUBLE_EQ(-4.0007112633153277, free_energy(f, beta));
  EXPECT_DOUBLE_EQ(-3.9941706779898838, energy(f, beta));
  EXPECT_DOUBLE_EQ(0.024138928587813167, specific_heat(f, beta));
}